

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.h
# Opt level: O0

bool absl::numbers_internal::safe_strtoi_base<int>(string_view s,Nonnull<int_*> out,int base)

{
  string_view text;
  bool bVar1;
  undefined4 in_ECX;
  int *in_RDX;
  char *in_RDI;
  int32_t val;
  bool kUse64Bit;
  bool kIsSigned;
  bool parsed;
  int in_stack_ffffffffffffffdc;
  byte in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe3;
  
  text._M_str = in_RDI;
  text._M_len = (size_t)in_RDX;
  bVar1 = safe_strto32_base(text,(Nonnull<int32_t_*>)
                                 CONCAT44(in_ECX,CONCAT13(in_stack_ffffffffffffffe3,
                                                          CONCAT12(1,(ushort)
                                                  in_stack_ffffffffffffffe0))),
                            in_stack_ffffffffffffffdc);
  *in_RDX = in_stack_ffffffffffffffdc;
  return bVar1;
}

Assistant:

ABSL_MUST_USE_RESULT bool safe_strtoi_base(absl::string_view s,
                                           absl::Nonnull<int_type*> out,
                                           int base) {
  static_assert(sizeof(*out) == 4 || sizeof(*out) == 8,
                "SimpleAtoi works only with 32-bit or 64-bit integers.");
  static_assert(!std::is_floating_point<int_type>::value,
                "Use SimpleAtof or SimpleAtod instead.");
  bool parsed;
  // TODO(jorg): This signed-ness check is used because it works correctly
  // with enums, and it also serves to check that int_type is not a pointer.
  // If one day something like std::is_signed<enum E> works, switch to it.
  // These conditions are constexpr bools to suppress MSVC warning C4127.
  constexpr bool kIsSigned = static_cast<int_type>(1) - 2 < 0;
  constexpr bool kUse64Bit = sizeof(*out) == 64 / 8;
  if (kIsSigned) {
    if (kUse64Bit) {
      int64_t val;
      parsed = numbers_internal::safe_strto64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      int32_t val;
      parsed = numbers_internal::safe_strto32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  } else {
    if (kUse64Bit) {
      uint64_t val;
      parsed = numbers_internal::safe_strtou64_base(s, &val, base);
      *out = static_cast<int_type>(val);
    } else {
      uint32_t val;
      parsed = numbers_internal::safe_strtou32_base(s, &val, base);
      *out = static_cast<int_type>(val);
    }
  }
  return parsed;
}